

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrint(char *string)

{
  byte *pbVar1;
  char cVar2;
  uint uVar3;
  int __c;
  char *pch;
  ulong uVar4;
  byte bVar5;
  
  if (string != (char *)0x0) {
    bVar5 = *string;
    while (bVar5 != 0) {
      uVar3 = (uint)bVar5;
      if ((byte)(bVar5 - 0x20) < 0x5f) {
LAB_00102a05:
        putchar(uVar3);
      }
      else {
        putchar(0x5c);
        if (bVar5 == 0xd) {
          uVar3 = 0x72;
          goto LAB_00102a05;
        }
        if (bVar5 == 10) {
          uVar3 = 0x6e;
          goto LAB_00102a05;
        }
        putchar(0x78);
        cVar2 = *string;
        uVar4 = 3;
        bVar5 = 4;
        do {
          uVar3 = (uint)((ulong)(long)cVar2 >> (bVar5 & 0x3f)) & 0xf;
          __c = uVar3 + 0x30;
          if (9 < uVar3) {
            __c = uVar3 + 0x37;
          }
          putchar(__c);
          uVar4 = uVar4 - 1;
          bVar5 = bVar5 - 4;
        } while (1 < uVar4);
      }
      pbVar1 = (byte *)(string + 1);
      string = string + 1;
      bVar5 = *pbVar1;
    }
  }
  return;
}

Assistant:

void UnityPrint(const char* string)
{
    const char* pch = string;

    if (pch != NULL)
    {
        while (*pch)
        {
            /* printable characters plus CR & LF are printed */
            if ((*pch <= 126) && (*pch >= 32))
            {
                UNITY_OUTPUT_CHAR(*pch);
            }
            /* write escaped carriage returns */
            else if (*pch == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (*pch == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('x');
                UnityPrintNumberHex((_U_UINT)*pch, 2);
            }
            pch++;
        }
    }
}